

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  undefined1 uVar1;
  undefined1 uVar2;
  FT_Outline *outline_00;
  FT_Memory memory_00;
  SDF_Params internal_params_00;
  SDF_Params internal_params_01;
  FT_Orientation FVar3;
  undefined2 uStack_4e;
  SDF_Params internal_params;
  SDF_Shape *shape;
  FT_Memory memory;
  SDF_Raster_Params *sdf_params;
  FT_Outline *outline;
  SDF_TRaster *sdf_raster;
  FT_Error error;
  FT_Raster_Params *params_local;
  FT_Raster raster_local;
  
  sdf_raster._4_4_ = 0;
  internal_params.flip_sign = '\0';
  internal_params.flip_y = '\0';
  internal_params._6_2_ = 0;
  internal_params.overload_sign = 0;
  if ((raster == (FT_Raster)0x0) || (params == (FT_Raster_Params *)0x0)) {
    sdf_raster._4_4_ = 6;
  }
  else {
    outline_00 = (FT_Outline *)params->source;
    if (outline_00 == (FT_Outline *)0x0) {
      sdf_raster._4_4_ = 0x14;
    }
    else if ((0 < outline_00->n_points) && (0 < outline_00->n_contours)) {
      if ((outline_00->contours == (short *)0x0) || (outline_00->points == (FT_Vector *)0x0)) {
        sdf_raster._4_4_ = 0x14;
      }
      else if ((*(uint *)&params[1].target < 0x21) && (1 < *(uint *)&params[1].target)) {
        memory_00 = *(FT_Memory *)raster;
        if (memory_00 == (FT_Memory)0x0) {
          sdf_raster._4_4_ = 0x20;
        }
        else {
          FVar3 = FT_Outline_Get_Orientation(outline_00);
          uVar1 = *(undefined1 *)((long)&params[1].target + 4);
          uVar2 = *(undefined1 *)((long)&params[1].target + 5);
          internal_params.orientation = FT_ORIENTATION_FILL_RIGHT;
          sdf_raster._4_4_ = sdf_shape_new(memory_00,(SDF_Shape **)&internal_params.flip_sign);
          if ((sdf_raster._4_4_ == 0) &&
             (sdf_raster._4_4_ =
                   sdf_outline_decompose(outline_00,(SDF_Shape *)internal_params._4_8_),
             sdf_raster._4_4_ == 0)) {
            if (*(char *)((long)&params[1].target + 6) == '\0') {
              internal_params_00.flip_sign = uVar1;
              internal_params_00.orientation = FVar3;
              internal_params_00.flip_y = uVar2;
              internal_params_00._6_2_ = uStack_4e;
              internal_params_00.overload_sign = internal_params.orientation;
              sdf_raster._4_4_ =
                   sdf_generate_subdivision
                             (internal_params_00,(SDF_Shape *)internal_params._4_8_,
                              *(FT_UInt *)&params[1].target,params->target);
            }
            else {
              internal_params_01.flip_sign = uVar1;
              internal_params_01.orientation = FVar3;
              internal_params_01.flip_y = uVar2;
              internal_params_01._6_2_ = uStack_4e;
              internal_params_01.overload_sign = internal_params.orientation;
              sdf_raster._4_4_ =
                   sdf_generate_with_overlaps
                             (internal_params_01,(SDF_Shape *)internal_params._4_8_,
                              *(FT_UInt *)&params[1].target,params->target);
            }
            if ((sdf_raster._4_4_ == 0) && (internal_params._4_8_ != 0)) {
              sdf_shape_done((SDF_Shape **)&internal_params.flip_sign);
            }
          }
        }
      }
      else {
        sdf_raster._4_4_ = 6;
      }
    }
  }
  return sdf_raster._4_4_;
}

Assistant:

static FT_Error
  sdf_raster_render( FT_Raster                raster,
                     const FT_Raster_Params*  params )
  {
    FT_Error                  error      = FT_Err_Ok;
    SDF_TRaster*              sdf_raster = (SDF_TRaster*)raster;
    FT_Outline*               outline    = NULL;
    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;

    FT_Memory   memory = NULL;
    SDF_Shape*  shape  = NULL;
    SDF_Params  internal_params;


    /* check for valid arguments */
    if ( !sdf_raster || !sdf_params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    outline = (FT_Outline*)sdf_params->root.source;

    /* check whether outline is valid */
    if ( !outline )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* if the outline is empty, return */
    if ( outline->n_points <= 0 || outline->n_contours <= 0 )
      goto Exit;

    /* check whether the outline has valid fields */
    if ( !outline->contours || !outline->points )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params' is invalid,\n" ));
      FT_TRACE0(( "                  "
                  " the value of this field must be within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                  "
                  " Also, you must pass `SDF_Raster_Params' instead of\n" ));
      FT_TRACE0(( "                  "
                  " the default `FT_Raster_Params' while calling\n" ));
      FT_TRACE0(( "                  "
                  " this function and set the fields properly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = sdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " Raster not setup properly,\n" ));
      FT_TRACE0(( "                  "
                  " unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* set up the parameters */
    internal_params.orientation   = FT_Outline_Get_Orientation( outline );
    internal_params.flip_sign     = sdf_params->flip_sign;
    internal_params.flip_y        = sdf_params->flip_y;
    internal_params.overload_sign = 0;

    FT_CALL( sdf_shape_new( memory, &shape ) );

    FT_CALL( sdf_outline_decompose( outline, shape ) );

    if ( sdf_params->overlaps )
      FT_CALL( sdf_generate_with_overlaps( internal_params,
                                           shape, sdf_params->spread,
                                           sdf_params->root.target ) );
    else
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         shape, sdf_params->spread,
                                         sdf_params->root.target ) );

    if ( shape )
      sdf_shape_done( &shape );

  Exit:
    return error;
  }